

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

uint8_t * skip_aux(uint8_t *s)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  
  uVar2 = aux_type2size(*s);
  if ((char)uVar2 == 'B') {
    iVar3 = aux_type2size(s[1]);
    puVar6 = s + (ulong)(uint)(iVar3 * *(int *)(s + 2)) + 6;
  }
  else {
    puVar5 = s + 1;
    uVar4 = uVar2 & 0xff;
    if ((uVar4 == 0x48) || (uVar4 == 0x5a)) {
      do {
        puVar6 = puVar5 + 1;
        uVar1 = *puVar5;
        puVar5 = puVar6;
      } while (uVar1 != '\0');
    }
    else {
      if (uVar4 == 0) {
        abort();
      }
      puVar6 = puVar5 + uVar2;
    }
  }
  return puVar6;
}

Assistant:

static inline uint8_t *skip_aux(uint8_t *s)
{
    int size = aux_type2size(*s); ++s; // skip type
    uint32_t n;
    switch (size) {
    case 'Z':
    case 'H':
        while (*s) ++s;
        return s + 1;
    case 'B':
        size = aux_type2size(*s); ++s;
        memcpy(&n, s, 4); s += 4;
        return s + size * n;
    case 0:
        abort();
        break;
    default:
        return s + size;
    }
}